

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCode __thiscall
PDFDocumentHandler::CopyPageContentToTargetPageRecoded
          (PDFDocumentHandler *this,PDFPage *inPage,PDFDictionary *inPageObject)

{
  PDFParser *pPVar1;
  EStatusCode EVar2;
  bool bVar3;
  EPDFObjectType EVar4;
  PDFObject *pPVar5;
  PageContentContext *inContentContext;
  PDFStreamInput *pPVar6;
  PDFArray *this_00;
  value_type inValue;
  PDFIndirectObjectReference *pPVar7;
  Trace *pTVar8;
  char *pcVar9;
  undefined1 local_b8 [8];
  PDFObjectCastPtr<PDFStreamInput> contentStream;
  PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> it;
  PageContentContext *pageContentContext;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  RefCountPtr<PDFObject> pageContent;
  EStatusCode status;
  PDFDictionary *inPageObject_local;
  PDFPage *inPage_local;
  PDFDocumentHandler *this_local;
  
  pageContent.mValue._4_4_ = eSuccess;
  pPVar1 = this->mParser;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Contents",&local_61);
  pPVar5 = PDFParser::QueryDictionaryObject(pPVar1,inPageObject,&local_60);
  RefCountPtr<PDFObject>::RefCountPtr((RefCountPtr<PDFObject> *)local_40,pPVar5);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar3 = RefCountPtr<PDFObject>::operator!((RefCountPtr<PDFObject> *)local_40);
  if (!bVar3) {
    inContentContext =
         PDFHummus::DocumentContext::StartPageContentContext(this->mDocumentContext,inPage);
    pPVar5 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_40);
    EVar4 = PDFObject::GetType(pPVar5);
    if (EVar4 == ePDFObjectStream) {
      pPVar6 = (PDFStreamInput *)RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_40);
      pageContent.mValue._4_4_ = WritePDFStreamInputToContentContext(this,inContentContext,pPVar6);
    }
    else {
      pPVar5 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_40);
      EVar4 = PDFObject::GetType(pPVar5);
      if (EVar4 == ePDFObjectArray) {
        this_00 = (PDFArray *)RefCountPtr<PDFObject>::GetPtr((RefCountPtr<PDFObject> *)local_40);
        PDFArray::GetIterator
                  ((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                    *)&refItem.super_RefCountPtr<PDFIndirectObjectReference>.mValue,this_00);
        PDFObjectCastPtr<PDFIndirectObjectReference>::PDFObjectCastPtr
                  ((PDFObjectCastPtr<PDFIndirectObjectReference> *)
                   &contentStream.super_RefCountPtr<PDFStreamInput>.mValue);
        do {
          bVar3 = ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>::
                  MoveNext((ContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                            *)&refItem.super_RefCountPtr<PDFIndirectObjectReference>.mValue);
          if (!bVar3 || pageContent.mValue._4_4_ != eSuccess) break;
          inValue = SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                    ::GetItem((SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_>
                               *)&refItem.super_RefCountPtr<PDFIndirectObjectReference>.mValue);
          PDFObjectCastPtr<PDFIndirectObjectReference>::operator=
                    ((PDFObjectCastPtr<PDFIndirectObjectReference> *)
                     &contentStream.super_RefCountPtr<PDFStreamInput>.mValue,inValue);
          bVar3 = RefCountPtr<PDFIndirectObjectReference>::operator!
                            ((RefCountPtr<PDFIndirectObjectReference> *)
                             &contentStream.super_RefCountPtr<PDFStreamInput>.mValue);
          if (bVar3) {
            pageContent.mValue._4_4_ = eFailure;
            pTVar8 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar8,
                              "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs"
                             );
            break;
          }
          pPVar1 = this->mParser;
          pPVar7 = RefCountPtr<PDFIndirectObjectReference>::operator->
                             ((RefCountPtr<PDFIndirectObjectReference> *)
                              &contentStream.super_RefCountPtr<PDFStreamInput>.mValue);
          pPVar5 = PDFParser::ParseNewObject(pPVar1,pPVar7->mObjectID);
          PDFObjectCastPtr<PDFStreamInput>::PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFStreamInput> *)local_b8,pPVar5);
          bVar3 = RefCountPtr<PDFStreamInput>::operator!((RefCountPtr<PDFStreamInput> *)local_b8);
          if (bVar3) {
            pageContent.mValue._4_4_ = eFailure;
            pTVar8 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar8,
                              "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams"
                             );
            pageContentContext._0_4_ = 3;
          }
          else {
            pPVar6 = RefCountPtr<PDFStreamInput>::GetPtr((RefCountPtr<PDFStreamInput> *)local_b8);
            pageContent.mValue._4_4_ =
                 WritePDFStreamInputToContentContext(this,inContentContext,pPVar6);
            pageContentContext._0_4_ = 0;
          }
          PDFObjectCastPtr<PDFStreamInput>::~PDFObjectCastPtr
                    ((PDFObjectCastPtr<PDFStreamInput> *)local_b8);
        } while ((int)pageContentContext == 0);
        PDFObjectCastPtr<PDFIndirectObjectReference>::~PDFObjectCastPtr
                  ((PDFObjectCastPtr<PDFIndirectObjectReference> *)
                   &contentStream.super_RefCountPtr<PDFStreamInput>.mValue);
      }
      else {
        pTVar8 = Trace::DefaultTrace();
        pPVar5 = RefCountPtr<PDFObject>::operator->((RefCountPtr<PDFObject> *)local_40);
        EVar4 = PDFObject::GetType(pPVar5);
        pcVar9 = PDFObject::scPDFObjectTypeLabel(EVar4);
        Trace::TraceToLog(pTVar8,
                          "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s"
                          ,pcVar9);
        pageContent.mValue._4_4_ = eFailure;
      }
    }
    if (pageContent.mValue._4_4_ == eSuccess) {
      PDFHummus::DocumentContext::EndPageContentContext(this->mDocumentContext,inContentContext);
    }
    else if (inContentContext != (PageContentContext *)0x0) {
      (*(inContentContext->super_AbstractContentContext)._vptr_AbstractContentContext[1])();
    }
  }
  EVar2 = pageContent.mValue._4_4_;
  RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)local_40);
  return EVar2;
}

Assistant:

EStatusCode PDFDocumentHandler::CopyPageContentToTargetPageRecoded(PDFPage* inPage,PDFDictionary* inPageObject)
{
	EStatusCode status = PDFHummus::eSuccess;
    
	RefCountPtr<PDFObject> pageContent(mParser->QueryDictionaryObject(inPageObject,"Contents"));
    
    // for empty page, do nothing
    if(!pageContent)
        return status;
    
	PageContentContext* pageContentContext = mDocumentContext->StartPageContentContext(inPage);
	if(pageContent->GetType() == PDFObject::ePDFObjectStream)
	{
		status = WritePDFStreamInputToContentContext(pageContentContext,(PDFStreamInput*)pageContent.GetPtr());
	}
	else if(pageContent->GetType() == PDFObject::ePDFObjectArray)
	{
		SingleValueContainerIterator<PDFObjectVector> it = ((PDFArray*)pageContent.GetPtr())->GetIterator();
		PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
		while(it.MoveNext() && status == PDFHummus::eSuccess)
		{
			refItem = it.GetItem();
			if(!refItem)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs");
				break;
			}
			PDFObjectCastPtr<PDFStreamInput> contentStream(mParser->ParseNewObject(refItem->mObjectID));
			if(!contentStream)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams");
				break;
			}
			status = WritePDFStreamInputToContentContext(pageContentContext,contentStream.GetPtr());
		}
	}
	else
	{
		TRACE_LOG1("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s",PDFObject::scPDFObjectTypeLabel(pageContent->GetType()));
		status = PDFHummus::eFailure;
	}
	
	if(status != PDFHummus::eSuccess)
	{
		delete pageContentContext;
	}
	else
	{
		mDocumentContext->EndPageContentContext(pageContentContext);
	}
	return status;
}